

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseField(Parser *this,StructDef *struct_def)

{
  SymbolTable<flatbuffers::Value> *this_00;
  pointer *pppVVar1;
  string *psVar2;
  char cVar3;
  undefined8 uVar4;
  BaseType BVar5;
  BaseType BVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  Presence PVar11;
  unsigned_long langs;
  StructDef *pSVar12;
  long lVar13;
  Value *pVVar14;
  HashFunction p_Var15;
  HashFunction p_Var16;
  HashFunction p_Var17;
  EnumVal *pEVar18;
  Value *pVVar19;
  byte *pbVar20;
  string *in_RDX;
  ulong uVar22;
  int t;
  string *psVar23;
  Type *this_01;
  FieldDef *pFVar24;
  string type_name;
  Type local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Value *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  FieldDef *local_120;
  FieldDef *typefield;
  FieldDef *field;
  Type local_108;
  string name;
  voffset_t id;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dc;
  Type local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  byte *pbVar21;
  
  this_01 = (Type *)&type_name;
  std::__cxx11::string::string
            ((string *)&name,(string *)&(struct_def->super_Definition).file._M_string_length);
  pSVar12 = LookupCreateStruct((Parser *)struct_def,&name,false,false);
  if (pSVar12 != (StructDef *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"field name can not be the same as table/struct name",
               (allocator<char> *)&type_name);
    Error(this,(string *)struct_def);
    std::__cxx11::string::~string((string *)&local_158);
    goto LAB_00106c4e;
  }
  for (uVar22 = 0; name._M_string_length != uVar22; uVar22 = uVar22 + 1) {
    cVar3 = name._M_dataplus._M_p[uVar22];
    if ((0x19 < (int)cVar3 - 0x61U) && (cVar3 != '_' && 9 < (int)cVar3 - 0x30U)) {
      if (uVar22 < name._M_string_length) {
        std::operator+(&local_158,"field names should be lowercase snake_case, got: ",&name);
        Warning((Parser *)struct_def,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
      }
      break;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&dc,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&(struct_def->super_Definition).doc_comment.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
  t = (int)struct_def;
  Expect(this,t);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    CheckedError::~CheckedError((CheckedError *)this);
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      local_158.field_2._M_allocated_capacity._0_2_ = 0;
      local_158.field_2._M_allocated_capacity._2_6_ = 0;
      local_158.field_2._8_2_ = 0;
      local_158._M_dataplus._M_p._0_4_ = 0;
      local_158._M_dataplus._M_p._4_4_ = 0;
      local_158._M_string_length._0_2_ = 0;
      local_158._M_string_length._2_2_ = 0;
      local_158._M_string_length._4_4_ = 0;
      ParseType(this,(Type *)struct_def);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        CheckedError::~CheckedError((CheckedError *)this);
        uVar10 = (uint)local_158._M_dataplus._M_p;
        if (in_RDX[8].field_2._M_local_buf[0] == '\x01') {
          if ((uint)local_158._M_dataplus._M_p == 0x11) {
            if (local_158._M_dataplus._M_p._4_4_ == 0xf) {
              psVar23 = (string *)
                        CONCAT44(local_158._M_string_length._4_4_,
                                 CONCAT22(local_158._M_string_length._2_2_,
                                          (undefined2)local_158._M_string_length));
              if (psVar23[0x111] == (string)0x1) goto LAB_00106a1c;
              goto LAB_00106acc;
            }
            if (0xb < local_158._M_dataplus._M_p._4_4_ - 1) goto LAB_00106bb9;
LAB_00106aff:
            if ((uint)local_158._M_dataplus._M_p != 0x11) goto LAB_00106b48;
            pppVVar1 = &struct_def[5].super_Definition.attributes.vec.
                        super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(byte *)pppVVar1 = *(byte *)pppVVar1 | 1;
            if (((undefined1  [16])struct_def[5].super_Definition.name.field_2 &
                (undefined1  [16])0xffffffffffffb854) == (undefined1  [16])0x0) {
              uVar10 = 0x11;
              goto LAB_00106be9;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&type_name,
                       "Arrays are not yet supported in all the specified programming languages.",
                       (allocator<char> *)&local_178);
            Error(this,(string *)struct_def);
            this_01 = (Type *)&type_name;
          }
          else {
            if ((uint)local_158._M_dataplus._M_p == 0xf) {
              psVar23 = (string *)
                        CONCAT44(local_158._M_string_length._4_4_,
                                 CONCAT22(local_158._M_string_length._2_2_,
                                          (undefined2)local_158._M_string_length));
              if (psVar23[0x111] != (string)0x0) {
LAB_00106a1c:
                std::__cxx11::string::string((string *)&type_name,psVar23);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_108,
                           "Incomplete type in struct is not allowed, type name: ",
                           (allocator<char> *)&id);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_178,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_108,&type_name);
                Error(this,(string *)struct_def);
                std::__cxx11::string::~string((string *)&local_178);
                std::__cxx11::string::~string((string *)&local_108);
                this_01 = (Type *)&type_name;
                goto LAB_00106c3c;
              }
LAB_00106acc:
              if (psVar23[0x110] != (string)0x0) goto LAB_00106aff;
            }
            else if ((uint)local_158._M_dataplus._M_p - 1 < 0xc) goto LAB_00106be9;
LAB_00106bb9:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&type_name,"structs may contain only scalar or struct fields",
                       (allocator<char> *)&local_178);
            Error(this,(string *)struct_def);
            this_01 = (Type *)&type_name;
          }
        }
        else {
          if ((uint)local_158._M_dataplus._M_p != 0x11) {
LAB_00106b48:
            typefield = (FieldDef *)0x0;
            if ((uint)local_158._M_dataplus._M_p == 0x10) {
              lVar13 = CONCAT62(local_158.field_2._M_allocated_capacity._2_6_,
                                local_158.field_2._M_allocated_capacity._0_2_);
              type_name._M_string_length = *(size_type *)(lVar13 + 0xd8);
              type_name.field_2._M_allocated_capacity = *(size_type *)(lVar13 + 0xe0);
              type_name.field_2._8_8_ = *(undefined8 *)(lVar13 + 0xe8);
              type_name._M_dataplus._M_p._4_4_ =
                   (undefined4)((ulong)*(undefined8 *)(lVar13 + 0xd0) >> 0x20);
              type_name._M_dataplus._M_p._0_4_ = 1;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_178,&name,"_type");
              AddField(this,struct_def,in_RDX,&local_178,(FieldDef **)&type_name);
LAB_00106ccb:
              std::__cxx11::string::~string((string *)&local_178);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00106c41;
              CheckedError::~CheckedError((CheckedError *)this);
            }
            else {
LAB_00106be9:
              typefield = (FieldDef *)0x0;
              if (((uVar10 - 0xe & 0xfffffffb) == 0) && (local_158._M_dataplus._M_p._4_4_ == 0x10))
              {
                pppVVar1 = &struct_def[5].super_Definition.attributes.vec.
                            super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                *(byte *)pppVVar1 = *(byte *)pppVVar1 | 2;
                if (((undefined1  [16])struct_def[5].super_Definition.name.field_2 &
                    (undefined1  [16])0xfffffffffff47c34) != (undefined1  [16])0x0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&type_name,
                             "Vectors of unions are not yet supported in at least one of the specified programming languages."
                             ,(allocator<char> *)&local_178);
                  Error(this,(string *)struct_def);
                  this_01 = (Type *)&type_name;
                  goto LAB_00106c3c;
                }
                type_name.field_2._M_allocated_capacity =
                     CONCAT62(local_158.field_2._M_allocated_capacity._2_6_,
                              local_158.field_2._M_allocated_capacity._0_2_);
                type_name._M_dataplus._M_p = (pointer)0x10000000e;
                type_name._M_string_length = 0;
                type_name.field_2._8_8_ = type_name.field_2._8_8_ & 0xffffffffffff0000;
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_178,&name,"_type");
                AddField(this,struct_def,in_RDX,&local_178,(FieldDef **)&type_name);
                goto LAB_00106ccb;
              }
            }
            AddField(this,struct_def,in_RDX,(Type *)&name,(FieldDef **)&local_158);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00106c41;
            CheckedError::~CheckedError((CheckedError *)this);
            if (typefield != (FieldDef *)0x0) {
              typefield->sibling_union_field = field;
              field->sibling_union_field = typefield;
            }
            local_120 = typefield;
            pFVar24 = field;
            if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != 0x3d)
            goto LAB_00106e1b;
            Next(this);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              CheckedError::~CheckedError((CheckedError *)this);
              ParseSingleValue(this,(string *)struct_def,(Value *)field,(bool)((char)field + -0x38))
              ;
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                CheckedError::~CheckedError((CheckedError *)this);
                if ((((uint)local_158._M_dataplus._M_p == 0xf) &&
                    (*(char *)(CONCAT44(local_158._M_string_length._4_4_,
                                        CONCAT22(local_158._M_string_length._2_2_,
                                                 (undefined2)local_158._M_string_length)) + 0x110)
                     != '\0')) ||
                   ((in_RDX[8].field_2._M_local_buf[0] == '\x01' &&
                    (bVar7 = std::operator!=(&(field->value).constant,"0"), bVar7)))) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&type_name,
                             "default values are not supported for struct fields, table fields, or in structs."
                             ,(allocator<char> *)&local_178);
                  Error(this,(string *)struct_def);
                  this_01 = (Type *)&type_name;
                  goto LAB_00106c3c;
                }
                if (((uint)local_158._M_dataplus._M_p < 0x13) &&
                   ((0x46000U >> ((uint)local_158._M_dataplus._M_p & 0x1f) & 1) != 0)) {
                  pppVVar1 = &struct_def[5].super_Definition.attributes.vec.
                              super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  *(byte *)pppVVar1 = *(byte *)pppVVar1 | 8;
                  bVar7 = std::operator!=(&(field->value).constant,"0");
                  if ((bVar7) &&
                     (((undefined1  [16])struct_def[5].super_Definition.name.field_2 &
                      (undefined1  [16])0xfffffffffffcbfff) != (undefined1  [16])0x0)) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&type_name,
                               "Default values for strings and vectors are not supported in one of the specified programming languages"
                               ,(allocator<char> *)&local_178);
                    Error(this,(string *)struct_def);
                    this_01 = (Type *)&type_name;
                    goto LAB_00106c3c;
                  }
                }
                pFVar24 = field;
                if (((uint)local_158._M_dataplus._M_p == 0x12) ||
                   ((uint)local_158._M_dataplus._M_p == 0xe)) {
                  psVar2 = &(field->value).constant;
                  bVar7 = std::operator!=(psVar2,"0");
                  if ((bVar7) && (bVar7 = std::operator!=(psVar2,"[]"), bVar7)) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&type_name,
                               "The only supported default for vectors is `[]`.",
                               (allocator<char> *)&local_178);
                    Error(this,(string *)struct_def);
                    this_01 = (Type *)&type_name;
                    goto LAB_00106c3c;
                  }
                }
LAB_00106e1b:
                if ((uint)local_158._M_dataplus._M_p - 0xb < 2) {
                  if ((pFVar24->value).constant._M_string_length == 0) {
                    __assert_fail("false == text.empty()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                                  ,0x3f1,"CheckedError flatbuffers::Parser::ParseField(StructDef &)"
                                 );
                  }
                  psVar2 = &(pFVar24->value).constant;
                  pbVar21 = (byte *)(psVar2->_M_dataplus)._M_p;
                  do {
                    pbVar20 = pbVar21 + 1;
                    bVar9 = *pbVar21;
                    pbVar21 = pbVar20;
                  } while (bVar9 == 0x20);
                  if ((bVar9 == 0x2b) || (bVar9 == 0x2d)) {
                    bVar9 = *pbVar20;
                  }
                  if (((bVar9 != 0x5f) && (0x19 < (int)(char)(bVar9 & 0xdf) - 0x41U)) &&
                     (lVar13 = std::__cxx11::string::find_first_of((char *)psVar2,0x140ae5),
                     lVar13 == -1)) {
                    std::__cxx11::string::append((char *)psVar2);
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=(&(pFVar24->super_Definition).doc_comment,&dc);
                this_00 = &(pFVar24->super_Definition).attributes;
                ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)struct_def);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00106c41;
                CheckedError::~CheckedError((CheckedError *)this);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&type_name,"deprecated",(allocator<char> *)&local_178);
                pVVar14 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&type_name);
                pFVar24->deprecated = pVVar14 != (Value *)0x0;
                std::__cxx11::string::~string((string *)&type_name);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&type_name,"hash",(allocator<char> *)&local_178);
                pVVar14 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&type_name);
                std::__cxx11::string::~string((string *)&type_name);
                local_130 = pVVar14;
                if (pVVar14 != (Value *)0x0) {
                  uVar10 = (uint)local_158._M_dataplus._M_p;
                  if (((uint)local_158._M_dataplus._M_p - 0xe & 0xfffffffb) == 0) {
                    uVar10 = local_158._M_dataplus._M_p._4_4_;
                  }
                  if (uVar10 < 0xb) {
                    if ((0x60U >> (uVar10 & 0x1f) & 1) == 0) {
                      if ((0x180U >> (uVar10 & 0x1f) & 1) == 0) {
                        if ((0x600U >> (uVar10 & 0x1f) & 1) == 0) goto LAB_00107271;
                        p_Var15 = FindHashFunction64((pVVar14->constant)._M_dataplus._M_p);
                        if (p_Var15 != (HashFunction)0x0) goto LAB_00107008;
                        std::operator+(&type_name,"Unknown hashing algorithm for 64 bit types: ",
                                       &local_130->constant);
                        Error(this,(string *)struct_def);
                        this_01 = (Type *)&type_name;
                      }
                      else {
                        p_Var16 = FindHashFunction32((pVVar14->constant)._M_dataplus._M_p);
                        if (p_Var16 != (HashFunction)0x0) goto LAB_00107008;
                        std::operator+(&type_name,"Unknown hashing algorithm for 32 bit types: ",
                                       &local_130->constant);
                        Error(this,(string *)struct_def);
                        this_01 = (Type *)&type_name;
                      }
                    }
                    else {
                      p_Var17 = FindHashFunction16((pVVar14->constant)._M_dataplus._M_p);
                      if (p_Var17 != (HashFunction)0x0) goto LAB_00107008;
                      std::operator+(&type_name,"Unknown hashing algorithm for 16 bit types: ",
                                     &local_130->constant);
                      Error(this,(string *)struct_def);
                      this_01 = (Type *)&type_name;
                    }
                  }
                  else {
LAB_00107271:
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&type_name,
                               "only short, ushort, int, uint, long and ulong data types support hashing."
                               ,(allocator<char> *)&local_178);
                    Error(this,(string *)struct_def);
                    this_01 = (Type *)&type_name;
                  }
                  goto LAB_00106c3c;
                }
LAB_00107008:
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&type_name,"vector64",(allocator<char> *)&local_178);
                pVVar14 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&type_name);
                std::__cxx11::string::~string((string *)&type_name);
                if (pVVar14 != (Value *)0x0) {
                  if (((uint)local_158._M_dataplus._M_p != 0xe) &&
                     ((uint)local_158._M_dataplus._M_p != 0x12)) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&type_name,
                               "`vector64` attribute can only be applied on vectors.",
                               (allocator<char> *)&local_178);
                    Error(this,(string *)struct_def);
                    this_01 = (Type *)&type_name;
                    goto LAB_00106c3c;
                  }
                  local_158._M_dataplus._M_p._0_4_ = 0x12;
                  local_158.field_2._8_2_ = 0;
                  *(ulong *)((long)&(pFVar24->value).type.struct_def + 2) =
                       CONCAT26(local_158.field_2._M_allocated_capacity._0_2_,
                                CONCAT42(local_158._M_string_length._4_4_,
                                         local_158._M_string_length._2_2_));
                  *(ulong *)((long)&(pFVar24->value).type.enum_def + 2) =
                       (ulong)(uint6)local_158.field_2._M_allocated_capacity._2_6_;
                  (pFVar24->value).type.base_type = BASE_TYPE_VECTOR64;
                  *(ulong *)&(pFVar24->value).type.element =
                       CONCAT26(local_158._M_string_length._2_2_,
                                CONCAT24((undefined2)local_158._M_string_length,
                                         local_158._M_dataplus._M_p._4_4_));
                  *(undefined4 *)((long)&(pFVar24->value).type.struct_def + 4) =
                       local_158._M_string_length._4_4_;
                  pFVar24->offset64 = true;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&type_name,"offset64",(allocator<char> *)&local_178);
                pVVar14 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&type_name);
                std::__cxx11::string::~string((string *)&type_name);
                if (pVVar14 == (Value *)0x0) {
                  if ((pFVar24->offset64 & 1U) != 0) goto LAB_00107103;
                }
                else {
                  if ((uint)local_158._M_dataplus._M_p == 0x12) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&type_name,
                               "attribute `vector64` implies `offset64` and isn\'t required.",
                               (allocator<char> *)&local_178);
                    Warning((Parser *)struct_def,&type_name);
                    std::__cxx11::string::~string((string *)&type_name);
                  }
                  pFVar24->offset64 = true;
LAB_00107103:
                  if ((uint)local_158._M_dataplus._M_p == 0xd) goto LAB_0010717b;
                  if (((uint)local_158._M_dataplus._M_p != 0xe) &&
                     ((uint)local_158._M_dataplus._M_p != 0x12)) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&type_name,
                               "only string and vectors can have `offset64` attribute applied",
                               (allocator<char> *)&local_178);
                    Error(this,(string *)struct_def);
                    this_01 = (Type *)&type_name;
                    goto LAB_00106c3c;
                  }
                  if (local_158._M_dataplus._M_p._4_4_ - 1 < 0xc) {
                    if ((local_158._M_dataplus._M_p._4_4_ - 1 < 10) &&
                       (CONCAT62(local_158.field_2._M_allocated_capacity._2_6_,
                                 local_158.field_2._M_allocated_capacity._0_2_) != 0)) {
LAB_00107223:
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&type_name,
                                 "only vectors of scalars are allowed to be 64-bit.",
                                 (allocator<char> *)&local_178);
                      Error(this,(string *)struct_def);
                      this_01 = (Type *)&type_name;
                      goto LAB_00106c3c;
                    }
                  }
                  else if ((local_158._M_dataplus._M_p._4_4_ != 0xf) ||
                          (*(char *)(CONCAT44(local_158._M_string_length._4_4_,
                                              CONCAT22(local_158._M_string_length._2_2_,
                                                       (undefined2)local_158._M_string_length)) +
                                    0x110) == '\0')) goto LAB_00107223;
LAB_0010717b:
                  if (((undefined1  [16])struct_def[5].super_Definition.name.field_2 &
                      (undefined1  [16])0xfffffffffffffe77) != (undefined1  [16])0x0) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&type_name,
                               "fields using 64-bit offsets are not yet supported in at least one of the specified programming languages."
                               ,(allocator<char> *)&local_178);
                    Error(this,(string *)struct_def);
                    this_01 = (Type *)&type_name;
                    goto LAB_00106c3c;
                  }
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&type_name,"key",(allocator<char> *)&local_178);
                pVVar14 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&type_name);
                pFVar24->key = pVVar14 != (Value *)0x0;
                std::__cxx11::string::~string((string *)&type_name);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&type_name,"required",(allocator<char> *)&local_178);
                pVVar14 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&type_name);
                bVar7 = true;
                if (pVVar14 == (Value *)0x0) {
                  if ((uint)local_158._M_dataplus._M_p == 0xd) {
                    bVar7 = pFVar24->key;
                  }
                  else {
                    bVar7 = false;
                  }
                }
                std::__cxx11::string::~string((string *)&type_name);
                bVar8 = false;
                if (((uint)local_158._M_dataplus._M_p < 0x13) &&
                   (bVar8 = false, (0x46000U >> ((uint)local_158._M_dataplus._M_p & 0x1f) & 1) != 0)
                   ) {
                  bVar8 = std::operator!=(&(pFVar24->value).constant,"0");
                }
                if ((uint)local_158._M_dataplus._M_p - 1 < 0xc) {
                  bVar9 = std::operator==(&(pFVar24->value).constant,"null");
                }
                else {
                  bVar9 = (bVar8 | bVar7) ^ 1;
                }
                if ((bVar7 & bVar9) == 1) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&type_name,"Fields cannot be both optional and required.",
                             (allocator<char> *)&local_178);
                  Error(this,(string *)struct_def);
                  this_01 = (Type *)&type_name;
                }
                else {
                  PVar11 = FieldDef::MakeFieldPresence((bool)bVar9,bVar7);
                  pFVar24->presence = PVar11;
                  if ((bVar7 == false) ||
                     ((in_RDX[8].field_2._M_local_buf[0] == '\0' &&
                      (0xb < (uint)local_158._M_dataplus._M_p - 1)))) {
                    if (pFVar24->key == true) {
                      if (in_RDX[8].field_2._M_local_buf[3] == '\x01') {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&type_name,"only one field may be set as \'key\'",
                                   (allocator<char> *)&local_178);
                        Error(this,(string *)struct_def);
                        this_01 = (Type *)&type_name;
                      }
                      else {
                        in_RDX[8].field_2._M_local_buf[3] = '\x01';
                        if ((uint)local_158._M_dataplus._M_p - 1 < 0xd) goto LAB_001074ca;
                        if ((uint)local_158._M_dataplus._M_p == 0xf) {
LAB_00107604:
                          if (*(char *)(CONCAT44(local_158._M_string_length._4_4_,
                                                 CONCAT22(local_158._M_string_length._2_2_,
                                                          (undefined2)local_158._M_string_length)) +
                                       0x110) != '\0') goto LAB_001074ca;
                        }
                        else if ((uint)local_158._M_dataplus._M_p == 0x11) {
                          if (local_158._M_dataplus._M_p._4_4_ - 1 < 0xc) goto LAB_001074ca;
                          if (local_158._M_dataplus._M_p._4_4_ == 0xf) goto LAB_00107604;
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&type_name,
                                   "\'key\' field must be string, scalar type or fixed size array of scalars"
                                   ,(allocator<char> *)&local_178);
                        Error(this,(string *)struct_def);
                        this_01 = (Type *)&type_name;
                      }
                    }
                    else {
LAB_001074ca:
                      if (((pFVar24->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
                         (pFVar24->presence == kOptional)) {
                        pppVVar1 = &struct_def[5].super_Definition.attributes.vec.
                                    super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        *(byte *)pppVVar1 = *(byte *)pppVVar1 | 4;
                        lVar13 = CONCAT62(local_158.field_2._M_allocated_capacity._2_6_,
                                          local_158.field_2._M_allocated_capacity._0_2_);
                        if (lVar13 != 0) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&type_name,"null",(allocator<char> *)&local_178);
                          pEVar18 = SymbolTable<flatbuffers::EnumVal>::Lookup
                                              ((SymbolTable<flatbuffers::EnumVal> *)(lVar13 + 0xf0),
                                               &type_name);
                          std::__cxx11::string::~string((string *)&type_name);
                          if (pEVar18 != (EnumVal *)0x0) {
                            if (9 < (uint)local_158._M_dataplus._M_p - 1) {
                              __assert_fail("IsInteger(type.base_type)",
                                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                                            ,0x480,
                                            "CheckedError flatbuffers::Parser::ParseField(StructDef &)"
                                           );
                            }
                            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_178,
                                           "the default \'null\' is reserved for declaring optional scalar fields, it conflicts with declaration of enum \'"
                                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT62(local_158.field_2._M_allocated_capacity.
                                                        _2_6_,local_158.field_2.
                                                              _M_allocated_capacity._0_2_));
                            std::operator+(&type_name,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_178,"\'.");
                            Error(this,(string *)struct_def);
                            std::__cxx11::string::~string((string *)&type_name);
                            this_01 = &local_178;
                            goto LAB_00106c3c;
                          }
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&type_name,"key",(allocator<char> *)&local_178);
                        pVVar14 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&type_name);
                        std::__cxx11::string::~string((string *)&type_name);
                        if (pVVar14 == (Value *)0x0) {
                          uVar22 = *(ulong *)((long)&struct_def[5].super_Definition.name.field_2 + 8
                                             );
                          if ((uVar22 == 0) ||
                             (uVar22 < 0x80001 && (uVar22 & 0xfffffffffff41c50) == 0))
                          goto LAB_00107663;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&type_name,
                                     "Optional scalars are not yet supported in at least one of the specified programming languages."
                                     ,(allocator<char> *)&local_178);
                          Error(this,(string *)struct_def);
                          this_01 = (Type *)&type_name;
                        }
                        else {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&type_name,
                                     "only a non-optional scalar field can be used as a \'key\' field"
                                     ,(allocator<char> *)&local_178);
                          Error(this,(string *)struct_def);
                          this_01 = (Type *)&type_name;
                        }
                      }
                      else {
LAB_00107663:
                        lVar13 = CONCAT62(local_158.field_2._M_allocated_capacity._2_6_,
                                          local_158.field_2._M_allocated_capacity._0_2_);
                        if (lVar13 == 0) {
LAB_001077d6:
                          if ((pFVar24->deprecated == true) &&
                             (in_RDX[8].field_2._M_local_buf[0] == '\x01')) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&type_name,"can\'t deprecate fields in a struct",
                                       (allocator<char> *)&local_178);
                            Error(this,(string *)struct_def);
                            this_01 = (Type *)&type_name;
                          }
                          else {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&type_name,"cpp_type",(allocator<char> *)&local_178
                                      );
                            pVVar14 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&type_name);
                            std::__cxx11::string::~string((string *)&type_name);
                            if (pVVar14 != (Value *)0x0) {
                              if (local_130 == (Value *)0x0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&type_name,
                                           "cpp_type can only be used with a hashed field",
                                           (allocator<char> *)&local_178);
                                Error(this,(string *)struct_def);
                                this_01 = (Type *)&type_name;
                                goto LAB_00106c3c;
                              }
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&type_name,"cpp_ptr_type",
                                         (allocator<char> *)&local_178);
                              pVVar19 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&type_name);
                              std::__cxx11::string::~string((string *)&type_name);
                              if (pVVar19 == (Value *)0x0) {
                                pVVar19 = (Value *)operator_new(0x48);
                                Value::Value(pVVar19);
                                BVar5 = (pVVar14->type).base_type;
                                BVar6 = (pVVar14->type).element;
                                pSVar12 = (pVVar14->type).struct_def;
                                uVar4 = *(undefined8 *)((long)&(pVVar14->type).enum_def + 2);
                                *(undefined8 *)((long)&(pVVar19->type).struct_def + 2) =
                                     *(undefined8 *)((long)&(pVVar14->type).struct_def + 2);
                                *(undefined8 *)((long)&(pVVar19->type).enum_def + 2) = uVar4;
                                (pVVar19->type).base_type = BVar5;
                                (pVVar19->type).element = BVar6;
                                (pVVar19->type).struct_def = pSVar12;
                                std::__cxx11::string::assign((char *)&pVVar19->constant);
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&type_name,"cpp_ptr_type",
                                           (allocator<char> *)&local_178);
                                SymbolTable<flatbuffers::Value>::Add(this_00,&type_name,pVVar19);
                                std::__cxx11::string::~string((string *)&type_name);
                              }
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&type_name,"shared",(allocator<char> *)&local_178);
                            pVVar19 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&type_name);
                            pVVar14 = &pFVar24->value;
                            pFVar24->shared = pVVar19 != (Value *)0x0;
                            std::__cxx11::string::~string((string *)&type_name);
                            if ((pFVar24->shared == true) &&
                               ((pVVar14->type).base_type != BASE_TYPE_STRING)) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&type_name,
                                         "shared can only be defined on strings",
                                         (allocator<char> *)&local_178);
                              Error(this,(string *)struct_def);
                              this_01 = (Type *)&type_name;
                            }
                            else {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&type_name,"native_custom_alloc",
                                         (allocator<char> *)&local_178);
                              pVVar19 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&type_name);
                              std::__cxx11::string::~string((string *)&type_name);
                              if (pVVar19 == (Value *)0x0) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&type_name,"native_inline",
                                           (allocator<char> *)&local_178);
                                pVVar19 = SymbolTable<flatbuffers::Value>::Lookup
                                                    (this_00,&type_name);
                                pFVar24->native_inline = pVVar19 != (Value *)0x0;
                                std::__cxx11::string::~string((string *)&type_name);
                                if ((pFVar24->native_inline != true) ||
                                   (((((pVVar14->type).base_type == BASE_TYPE_STRUCT &&
                                      (((pFVar24->value).type.struct_def)->fixed != false)) ||
                                     (bVar7 = IsVectorOfStruct(&pVVar14->type), bVar7)) ||
                                    (bVar7 = IsVectorOfTable(&pVVar14->type), bVar7)))) {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&type_name,"nested_flatbuffer",
                                             (allocator<char> *)&local_178);
                                  pVVar14 = SymbolTable<flatbuffers::Value>::Lookup
                                                      (this_00,&type_name);
                                  std::__cxx11::string::~string((string *)&type_name);
                                  if (pVVar14 == (Value *)0x0) {
LAB_00107a8f:
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&type_name,"flexbuffer",
                                               (allocator<char> *)&local_178);
                                    pVVar14 = SymbolTable<flatbuffers::Value>::Lookup
                                                        (this_00,&type_name);
                                    std::__cxx11::string::~string((string *)&type_name);
                                    if (pVVar14 != (Value *)0x0) {
                                      pFVar24->flexbuffer = true;
                                      *(undefined1 *)
                                       &struct_def[5].super_Definition.attributes.vec.
                                        super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish = 1;
                                      if (((uint)local_158._M_dataplus._M_p != 0xe) ||
                                         (local_158._M_dataplus._M_p._4_4_ != 4)) {
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&type_name,
                                                                                                      
                                                  "flexbuffer attribute may only apply to a vector of ubyte"
                                                  ,(allocator<char> *)&local_178);
                                        Error(this,(string *)struct_def);
                                        this_01 = (Type *)&type_name;
                                        goto LAB_00106c3c;
                                      }
                                    }
                                    if (local_120 != (FieldDef *)0x0) {
                                      if (0xb < (local_120->value).type.base_type - BASE_TYPE_UTYPE)
                                      {
                                        local_120->presence = pFVar24->presence;
                                      }
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&type_name,"id",
                                                 (allocator<char> *)&local_178);
                                      pVVar14 = SymbolTable<flatbuffers::Value>::Lookup
                                                          (this_00,&type_name);
                                      std::__cxx11::string::~string((string *)&type_name);
                                      if (pVVar14 != (Value *)0x0) {
                                        id = 0;
                                        anon_unknown_0::atot<unsigned_short>
                                                  ((anon_unknown_0 *)&type_name,
                                                   (pVVar14->constant)._M_dataplus._M_p,
                                                   (Parser *)struct_def,&id);
                                        cVar3 = (char)type_name._M_dataplus._M_p;
                                        type_name._M_dataplus._M_p._1_1_ = 1;
                                        CheckedError::~CheckedError((CheckedError *)&type_name);
                                        if ((cVar3 != '\0') || (id == 0)) {
                                          std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_108,
                                                  "a union type effectively adds two fields with non-negative ids, its id must be that of the second field (the first field is the type field and not explicitly declared in the schema);\nfield: "
                                                  ,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)pFVar24);
                                          std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_178,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_108,", id: ");
                                          std::operator+(&type_name,
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_178,&pVVar14->constant);
                                          Error(this,(string *)struct_def);
                                          std::__cxx11::string::~string((string *)&type_name);
                                          std::__cxx11::string::~string((string *)&local_178);
                                          this_01 = &local_108;
                                          goto LAB_00106c3c;
                                        }
                                        pVVar19 = (Value *)operator_new(0x48);
                                        Value::Value(pVVar19);
                                        BVar5 = (pVVar14->type).base_type;
                                        BVar6 = (pVVar14->type).element;
                                        pSVar12 = (pVVar14->type).struct_def;
                                        uVar4 = *(undefined8 *)((long)&(pVVar14->type).enum_def + 2)
                                        ;
                                        *(undefined8 *)((long)&(pVVar19->type).struct_def + 2) =
                                             *(undefined8 *)((long)&(pVVar14->type).struct_def + 2);
                                        *(undefined8 *)((long)&(pVVar19->type).enum_def + 2) = uVar4
                                        ;
                                        (pVVar19->type).base_type = BVar5;
                                        (pVVar19->type).element = BVar6;
                                        (pVVar19->type).struct_def = pSVar12;
                                        NumToString<int>(&type_name,id - 1);
                                        std::__cxx11::string::operator=
                                                  ((string *)&pVVar19->constant,(string *)&type_name
                                                  );
                                        std::__cxx11::string::~string((string *)&type_name);
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&type_name,"id",
                                                   (allocator<char> *)&local_178);
                                        SymbolTable<flatbuffers::Value>::Add
                                                  (&(local_120->super_Definition).attributes,
                                                   &type_name,pVVar19);
                                        std::__cxx11::string::~string((string *)&type_name);
                                      }
                                      if (pFVar24->deprecated == true) {
                                        local_120->deprecated = true;
                                      }
                                    }
                                    Expect(this,t);
                                    *(undefined1 *)
                                     ((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                                    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                                      CheckedError::~CheckedError((CheckedError *)this);
                                      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
                                    }
                                    goto LAB_00106c41;
                                  }
                                  if ((pVVar14->type).base_type == BASE_TYPE_STRING) {
                                    if ((((uint)local_158._M_dataplus._M_p - 0xe & 0xfffffffb) == 0)
                                       && (local_158._M_dataplus._M_p._4_4_ == 4)) {
                                      pSVar12 = LookupCreateStruct((Parser *)struct_def,
                                                                   &pVVar14->constant,true,false);
                                      pFVar24->nested_flatbuffer = pSVar12;
                                      goto LAB_00107a8f;
                                    }
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&type_name,
                                               "nested_flatbuffer attribute may only apply to a vector of ubyte"
                                               ,(allocator<char> *)&local_178);
                                    Error(this,(string *)struct_def);
                                    this_01 = (Type *)&type_name;
                                  }
                                  else {
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&type_name,
                                               "nested_flatbuffer attribute must be a string (the root type)"
                                               ,(allocator<char> *)&local_178);
                                    Error(this,(string *)struct_def);
                                    this_01 = (Type *)&type_name;
                                  }
                                }
                                else {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&type_name,
                                             "\'native_inline\' can only be defined on structs, vector of structs or vector of tables"
                                             ,(allocator<char> *)&local_178);
                                  Error(this,(string *)struct_def);
                                  this_01 = (Type *)&type_name;
                                }
                              }
                              else {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&type_name,
                                           "native_custom_alloc can only be used with a table or struct definition"
                                           ,(allocator<char> *)&local_178);
                                Error(this,(string *)struct_def);
                                this_01 = (Type *)&type_name;
                              }
                            }
                          }
                        }
                        else {
                          local_128 = &(pFVar24->value).constant;
                          switch((uint)local_158._M_dataplus._M_p) {
                          case 0xe:
                          case 0x12:
                            bVar7 = std::operator!=(local_128,"0");
                            if ((!bVar7) || (bVar7 = std::operator!=(local_128,"[]"), !bVar7))
                            goto LAB_001077d6;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&type_name,"Vector defaults may only be `[]`.",
                                       (allocator<char> *)&local_178);
                            Error(this,(string *)struct_def);
                            this_01 = (Type *)&type_name;
                            break;
                          default:
                            if ((uint)local_158._M_dataplus._M_p - 1 < 10) {
                              if (pFVar24->presence != kOptional) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&type_name,"bit_flags",
                                           (allocator<char> *)&local_178);
                                pVVar14 = SymbolTable<flatbuffers::Value>::Lookup
                                                    ((SymbolTable<flatbuffers::Value> *)
                                                     (lVar13 + 0x58),&type_name);
                                std::__cxx11::string::~string((string *)&type_name);
                                if ((pVVar14 == (Value *)0x0) &&
                                   (pEVar18 = EnumDef::FindByValue
                                                        ((EnumDef *)
                                                         CONCAT62(local_158.field_2.
                                                                  _M_allocated_capacity._2_6_,
                                                                  local_158.field_2.
                                                                  _M_allocated_capacity._0_2_),
                                                         local_128), pEVar18 == (EnumVal *)0x0)) {
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_90,"default value of `",local_128);
                                  std::operator+(&local_70,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_90,"` for ");
                                  std::operator+(&local_50,&local_70,"field `");
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&id,&local_50,&name);
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_108,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&id,"` is not part of enum `");
                                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_178,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_108,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT62(local_158.field_2._M_allocated_capacity
                                                             ._2_6_,local_158.field_2.
                                                                    _M_allocated_capacity._0_2_));
                                  std::operator+(&type_name,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_178,"`.");
                                  Error(this,(string *)struct_def);
                                  std::__cxx11::string::~string((string *)&type_name);
                                  std::__cxx11::string::~string((string *)&local_178);
                                  std::__cxx11::string::~string((string *)&local_108);
                                  std::__cxx11::string::~string((string *)&id);
                                  std::__cxx11::string::~string((string *)&local_50);
                                  std::__cxx11::string::~string((string *)&local_70);
                                  this_01 = &local_90;
                                  break;
                                }
                              }
                              goto LAB_001077d6;
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&type_name,"Enums must have integer base types",
                                       (allocator<char> *)&local_178);
                            Error(this,(string *)struct_def);
                            this_01 = (Type *)&type_name;
                            break;
                          case 0x10:
                            bVar7 = std::operator!=(local_128,"0");
                            if (!bVar7) goto LAB_001077d6;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&type_name,"Union defaults must be NONE",
                                       (allocator<char> *)&local_178);
                            Error(this,(string *)struct_def);
                            break;
                          case 0x11:
                            bVar7 = std::operator!=(local_128,"0");
                            if (!bVar7) goto LAB_001077d6;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&type_name,"Array defaults are not supported yet.",
                                       (allocator<char> *)&local_178);
                            Error(this,(string *)struct_def);
                            this_01 = (Type *)&type_name;
                          }
                        }
                      }
                    }
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&type_name,
                               "only non-scalar fields in tables may be \'required\'",
                               (allocator<char> *)&local_178);
                    Error(this,(string *)struct_def);
                    this_01 = (Type *)&type_name;
                  }
                }
                goto LAB_00106c3c;
              }
            }
            goto LAB_00106c41;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&type_name,"fixed-length array in table must be wrapped in struct",
                     (allocator<char> *)&local_178);
          Error(this,(string *)struct_def);
          this_01 = (Type *)&type_name;
        }
LAB_00106c3c:
        std::__cxx11::string::~string((string *)this_01);
      }
    }
  }
LAB_00106c41:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dc);
LAB_00106c4e:
  std::__cxx11::string::~string((string *)&name);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseField(StructDef &struct_def) {
  std::string name = attribute_;

  if (LookupCreateStruct(name, false, false))
    return Error("field name can not be the same as table/struct name");

  if (!IsLowerSnakeCase(name)) {
    Warning("field names should be lowercase snake_case, got: " + name);
  }

  std::vector<std::string> dc = doc_comment_;
  EXPECT(kTokenIdentifier);
  EXPECT(':');
  Type type;
  ECHECK(ParseType(type));

  if (struct_def.fixed) {
    if (IsIncompleteStruct(type) ||
        (IsArray(type) && IsIncompleteStruct(type.VectorType()))) {
      std::string type_name = IsArray(type) ? type.VectorType().struct_def->name
                                            : type.struct_def->name;
      return Error(
          std::string("Incomplete type in struct is not allowed, type name: ") +
          type_name);
    }

    auto valid = IsScalar(type.base_type) || IsStruct(type);
    if (!valid && IsArray(type)) {
      const auto &elem_type = type.VectorType();
      valid |= IsScalar(elem_type.base_type) || IsStruct(elem_type);
    }
    if (!valid)
      return Error("structs may contain only scalar or struct fields");
  }

  if (!struct_def.fixed && IsArray(type))
    return Error("fixed-length array in table must be wrapped in struct");

  if (IsArray(type)) {
    advanced_features_ |= reflection::AdvancedArrayFeatures;
    if (!SupportsAdvancedArrayFeatures()) {
      return Error(
          "Arrays are not yet supported in all "
          "the specified programming languages.");
    }
  }

  FieldDef *typefield = nullptr;
  if (type.base_type == BASE_TYPE_UNION) {
    // For union fields, add a second auto-generated field to hold the type,
    // with a special suffix.

    // To ensure compatibility with many codes that rely on the BASE_TYPE_UTYPE value to identify union type fields.
    Type union_type(type.enum_def->underlying_type);
    union_type.base_type = BASE_TYPE_UTYPE;
    ECHECK(AddField(struct_def, name + UnionTypeFieldSuffix(),union_type, &typefield));
    
  } else if (IsVector(type) && type.element == BASE_TYPE_UNION) {
    advanced_features_ |= reflection::AdvancedUnionFeatures;
    // Only cpp, js and ts supports the union vector feature so far.
    if (!SupportsAdvancedUnionFeatures()) {
      return Error(
          "Vectors of unions are not yet supported in at least one of "
          "the specified programming languages.");
    }
    // For vector of union fields, add a second auto-generated vector field to
    // hold the types, with a special suffix.
    Type union_vector(BASE_TYPE_VECTOR, nullptr, type.enum_def);
    union_vector.element = BASE_TYPE_UTYPE;
    ECHECK(AddField(struct_def, name + UnionTypeFieldSuffix(), union_vector,
                    &typefield));
  }

  FieldDef *field;
  ECHECK(AddField(struct_def, name, type, &field));

  if (typefield) {
    // We preserve the relation between the typefield
    // and field, so we can easily map it in the code
    // generators.
    typefield->sibling_union_field = field;
    field->sibling_union_field = typefield;
  }

  if (token_ == '=') {
    NEXT();
    ECHECK(ParseSingleValue(&field->name, field->value, true));
    if (IsStruct(type) || (struct_def.fixed && field->value.constant != "0"))
      return Error(
          "default values are not supported for struct fields, table fields, "
          "or in structs.");
    if (IsString(type) || IsVector(type)) {
      advanced_features_ |= reflection::DefaultVectorsAndStrings;
      if (field->value.constant != "0" && !SupportsDefaultVectorsAndStrings()) {
        return Error(
            "Default values for strings and vectors are not supported in one "
            "of the specified programming languages");
      }
    }

    if (IsVector(type) && field->value.constant != "0" &&
        field->value.constant != "[]") {
      return Error("The only supported default for vectors is `[]`.");
    }
  }

  // Append .0 if the value has not it (skip hex and scientific floats).
  // This suffix needed for generated C++ code.
  if (IsFloat(type.base_type)) {
    auto &text = field->value.constant;
    FLATBUFFERS_ASSERT(false == text.empty());
    auto s = text.c_str();
    while (*s == ' ') s++;
    if (*s == '-' || *s == '+') s++;
    // 1) A float constants (nan, inf, pi, etc) is a kind of identifier.
    // 2) A float number needn't ".0" at the end if it has exponent.
    if ((false == IsIdentifierStart(*s)) &&
        (std::string::npos == field->value.constant.find_first_of(".eEpP"))) {
      field->value.constant += ".0";
    }
  }

  field->doc_comment = dc;
  ECHECK(ParseMetaData(&field->attributes));
  field->deprecated = field->attributes.Lookup("deprecated") != nullptr;
  auto hash_name = field->attributes.Lookup("hash");
  if (hash_name) {
    switch ((IsVector(type)) ? type.element : type.base_type) {
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT: {
        if (FindHashFunction16(hash_name->constant.c_str()) == nullptr)
          return Error("Unknown hashing algorithm for 16 bit types: " +
                       hash_name->constant);
        break;
      }
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT: {
        if (FindHashFunction32(hash_name->constant.c_str()) == nullptr)
          return Error("Unknown hashing algorithm for 32 bit types: " +
                       hash_name->constant);
        break;
      }
      case BASE_TYPE_LONG:
      case BASE_TYPE_ULONG: {
        if (FindHashFunction64(hash_name->constant.c_str()) == nullptr)
          return Error("Unknown hashing algorithm for 64 bit types: " +
                       hash_name->constant);
        break;
      }
      default:
        return Error(
            "only short, ushort, int, uint, long and ulong data types support "
            "hashing.");
    }
  }

  if (field->attributes.Lookup("vector64") != nullptr) {
    if (!IsVector(type)) {
      return Error("`vector64` attribute can only be applied on vectors.");
    }

    // Upgrade the type to be a BASE_TYPE_VECTOR64, since the attributes are
    // parsed after the type.
    const BaseType element_base_type = type.element;
    type = Type(BASE_TYPE_VECTOR64, type.struct_def, type.enum_def);
    type.element = element_base_type;

    // Since the field was already added to the parent object, update the type
    // in place.
    field->value.type = type;

    // 64-bit vectors imply the offset64 attribute.
    field->offset64 = true;
  }

  // Record that this field uses 64-bit offsets.
  if (field->attributes.Lookup("offset64") != nullptr) {
    // TODO(derekbailey): would be nice to have this be a recommendation or hint
    // instead of a warning.
    if (type.base_type == BASE_TYPE_VECTOR64) {
      Warning("attribute `vector64` implies `offset64` and isn't required.");
    }

    field->offset64 = true;
  }

  // Check for common conditions with Offset64 fields.
  if (field->offset64) {
    // TODO(derekbailey): this is where we can disable string support for
    // offset64, as that is not a hard requirement to have.
    if (!IsString(type) && !IsVector(type)) {
      return Error(
          "only string and vectors can have `offset64` attribute applied");
    }

    // If this is a Vector, only scalar and scalar-like (structs) items are
    // allowed.
    // TODO(derekbailey): allow vector of strings, just require that the strings
    // are Offset64<string>.
    if (IsVector(type) &&
        !((IsScalar(type.element) && !IsEnum(type.VectorType())) ||
          IsStruct(type.VectorType()))) {
      return Error("only vectors of scalars are allowed to be 64-bit.");
    }

    // Lastly, check if it is supported by the specified generated languages. Do
    // this last so the above checks can inform the user of schema errors to fix
    // first.
    if (!Supports64BitOffsets()) {
      return Error(
          "fields using 64-bit offsets are not yet supported in at least one "
          "of the specified programming languages.");
    }
  }

  // For historical convenience reasons, string keys are assumed required.
  // Scalars are kDefault unless otherwise specified.
  // Nonscalars are kOptional unless required;
  field->key = field->attributes.Lookup("key") != nullptr;
  const bool required = field->attributes.Lookup("required") != nullptr ||
                        (IsString(type) && field->key);
  const bool default_str_or_vec =
      ((IsString(type) || IsVector(type)) && field->value.constant != "0");
  const bool optional = IsScalar(type.base_type)
                            ? (field->value.constant == "null")
                            : !(required || default_str_or_vec);
  if (required && optional) {
    return Error("Fields cannot be both optional and required.");
  }
  field->presence = FieldDef::MakeFieldPresence(optional, required);

  if (required && (struct_def.fixed || IsScalar(type.base_type))) {
    return Error("only non-scalar fields in tables may be 'required'");
  }
  if (field->key) {
    if (struct_def.has_key) return Error("only one field may be set as 'key'");
    struct_def.has_key = true;
    auto is_valid =
        IsScalar(type.base_type) || IsString(type) || IsStruct(type);
    if (IsArray(type)) {
      is_valid |=
          IsScalar(type.VectorType().base_type) || IsStruct(type.VectorType());
    }
    if (!is_valid) {
      return Error(
          "'key' field must be string, scalar type or fixed size array of "
          "scalars");
    }
  }

  if (field->IsScalarOptional()) {
    advanced_features_ |= reflection::OptionalScalars;
    if (type.enum_def && type.enum_def->Lookup("null")) {
      FLATBUFFERS_ASSERT(IsInteger(type.base_type));
      return Error(
          "the default 'null' is reserved for declaring optional scalar "
          "fields, it conflicts with declaration of enum '" +
          type.enum_def->name + "'.");
    }
    if (field->attributes.Lookup("key")) {
      return Error(
          "only a non-optional scalar field can be used as a 'key' field");
    }
    if (!SupportsOptionalScalars()) {
      return Error(
          "Optional scalars are not yet supported in at least one of "
          "the specified programming languages.");
    }
  }

  if (type.enum_def) {
    // Verify the enum's type and default value.
    const std::string &constant = field->value.constant;
    if (type.base_type == BASE_TYPE_UNION) {
      if (constant != "0") { return Error("Union defaults must be NONE"); }
    } else if (IsVector(type)) {
      if (constant != "0" && constant != "[]") {
        return Error("Vector defaults may only be `[]`.");
      }
    } else if (IsArray(type)) {
      if (constant != "0") {
        return Error("Array defaults are not supported yet.");
      }
    } else {
      if (!IsInteger(type.base_type)) {
        return Error("Enums must have integer base types");
      }
      // Optional and bitflags enums may have default constants that are not
      // their specified variants.
      if (!field->IsOptional() &&
          type.enum_def->attributes.Lookup("bit_flags") == nullptr) {
        if (type.enum_def->FindByValue(constant) == nullptr) {
          return Error("default value of `" + constant + "` for " + "field `" +
                       name + "` is not part of enum `" + type.enum_def->name +
                       "`.");
        }
      }
    }
  }

  if (field->deprecated && struct_def.fixed)
    return Error("can't deprecate fields in a struct");

  auto cpp_type = field->attributes.Lookup("cpp_type");
  if (cpp_type) {
    if (!hash_name)
      return Error("cpp_type can only be used with a hashed field");
    /// forcing cpp_ptr_type to 'naked' if unset
    auto cpp_ptr_type = field->attributes.Lookup("cpp_ptr_type");
    if (!cpp_ptr_type) {
      auto val = new Value();
      val->type = cpp_type->type;
      val->constant = "naked";
      field->attributes.Add("cpp_ptr_type", val);
    }
  }

  field->shared = field->attributes.Lookup("shared") != nullptr;
  if (field->shared && field->value.type.base_type != BASE_TYPE_STRING)
    return Error("shared can only be defined on strings");

  auto field_native_custom_alloc =
      field->attributes.Lookup("native_custom_alloc");
  if (field_native_custom_alloc)
    return Error(
        "native_custom_alloc can only be used with a table or struct "
        "definition");

  field->native_inline = field->attributes.Lookup("native_inline") != nullptr;
  if (field->native_inline && !IsStruct(field->value.type) &&
      !IsVectorOfStruct(field->value.type) &&
      !IsVectorOfTable(field->value.type))
    return Error(
        "'native_inline' can only be defined on structs, vector of structs or "
        "vector of tables");

  auto nested = field->attributes.Lookup("nested_flatbuffer");
  if (nested) {
    if (nested->type.base_type != BASE_TYPE_STRING)
      return Error(
          "nested_flatbuffer attribute must be a string (the root type)");
    if (!IsVector(type.base_type) || type.element != BASE_TYPE_UCHAR)
      return Error(
          "nested_flatbuffer attribute may only apply to a vector of ubyte");
    // This will cause an error if the root type of the nested flatbuffer
    // wasn't defined elsewhere.
    field->nested_flatbuffer = LookupCreateStruct(nested->constant);
  }

  if (field->attributes.Lookup("flexbuffer")) {
    field->flexbuffer = true;
    uses_flexbuffers_ = true;
    if (type.base_type != BASE_TYPE_VECTOR || type.element != BASE_TYPE_UCHAR)
      return Error("flexbuffer attribute may only apply to a vector of ubyte");
  }

  if (typefield) {
    if (!IsScalar(typefield->value.type.base_type)) {
      // this is a union vector field
      typefield->presence = field->presence;
    }
    // If this field is a union, and it has a manually assigned id,
    // the automatically added type field should have an id as well (of N - 1).
    auto attr = field->attributes.Lookup("id");
    if (attr) {
      const auto &id_str = attr->constant;
      voffset_t id = 0;
      const auto done = !atot(id_str.c_str(), *this, &id).Check();
      if (done && id > 0) {
        auto val = new Value();
        val->type = attr->type;
        val->constant = NumToString(id - 1);
        typefield->attributes.Add("id", val);
      } else {
        return Error(
            "a union type effectively adds two fields with non-negative ids, "
            "its id must be that of the second field (the first field is "
            "the type field and not explicitly declared in the schema);\n"
            "field: " +
            field->name + ", id: " + id_str);
      }
    }
    // if this field is a union that is deprecated,
    // the automatically added type field should be deprecated as well
    if (field->deprecated) { typefield->deprecated = true; }
  }

  EXPECT(';');
  return NoError();
}